

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_addloc(lua_State *L,char *msg,cTValue *frame,cTValue *nextframe)

{
  uint64_t uVar1;
  uint uVar2;
  GCfunc *fn_00;
  char local_88 [8];
  char buf [60];
  GCproto *pt;
  BCLine line;
  GCfunc *fn;
  cTValue *nextframe_local;
  cTValue *frame_local;
  char *msg_local;
  lua_State *L_local;
  
  if (((frame == (cTValue *)0x0) ||
      (fn_00 = (GCfunc *)(frame[-1].u64 & 0x7fffffffffff), (fn_00->c).ffid != '\0')) ||
     (uVar2 = debug_frameline(L,fn_00,nextframe), (int)uVar2 < 0)) {
    lj_strfmt_pushf(L,"%s",msg);
  }
  else {
    uVar1 = (fn_00->c).pc.ptr64;
    lj_debug_shortname(local_88,*(GCstr **)(uVar1 - 0x28),*(BCLine *)(uVar1 - 0x20));
    lj_strfmt_pushf(L,"%s:%d: %s",local_88,(ulong)uVar2,msg);
  }
  return;
}

Assistant:

void lj_debug_addloc(lua_State *L, const char *msg,
		     cTValue *frame, cTValue *nextframe)
{
  if (frame) {
    GCfunc *fn = frame_func(frame);
    if (isluafunc(fn)) {
      BCLine line = debug_frameline(L, fn, nextframe);
      if (line >= 0) {
	GCproto *pt = funcproto(fn);
	char buf[LUA_IDSIZE];
	lj_debug_shortname(buf, proto_chunkname(pt), pt->firstline);
	lj_strfmt_pushf(L, "%s:%d: %s", buf, line, msg);
	return;
      }
    }
  }
  lj_strfmt_pushf(L, "%s", msg);
}